

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-input.c
# Opt level: O3

int fy_parse_input_open(fy_parser *fyp,fy_input *fyi)

{
  fy_input_type fVar1;
  int iVar2;
  void *pvVar3;
  FILE *pFVar4;
  size_t __size;
  size_t __size_00;
  char **in_RDX;
  int iVar5;
  char *fmt;
  stat sb;
  stat local_b8;
  
  iVar5 = -1;
  if (fyi == (fy_input *)0x0) {
    return -1;
  }
  if (fyi->state != FYIS_QUEUED) {
    __assert_fail("fyi->state == FYIS_QUEUED",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                  ,0x13f,"int fy_parse_input_open(struct fy_parser *, struct fy_input *)");
  }
  fyi->read = 0;
  fyi->chunk = 0;
  fyi->buffer = (void *)0x0;
  fyi->allocated = 0;
  fyi->fp = (FILE *)0x0;
  fVar1 = (fyi->cfg).type;
  if (fVar1 - fyit_memory < 2) {
LAB_0013a6d7:
    fyi->state = FYIS_PARSE_IN_PROGRESS;
    iVar5 = 0;
  }
  else {
    if (fVar1 == fyit_stream) {
      __size_00 = (fyi->cfg).field_2.stream.chunk;
      fyi->chunk = __size_00;
      if (__size_00 == 0) {
        __size_00 = sysconf(0x1e);
        fyi->chunk = __size_00;
      }
      pvVar3 = malloc(__size_00);
      fyi->buffer = pvVar3;
      if (pvVar3 != (void *)0x0) {
        fyi->allocated = __size_00;
        fyi->fp = (fyi->cfg).field_2.stream.fp;
        goto LAB_0013a6d7;
      }
      fmt = "fy_alloc() failed";
      iVar2 = 0x17b;
    }
    else {
      if (fVar1 != fyit_file) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                      ,0x189,"int fy_parse_input_open(struct fy_parser *, struct fy_input *)");
      }
      *(undefined8 *)&fyi->field_11 = 0;
      (fyi->field_11).file.addr = (void *)0x0;
      (fyi->field_11).file.length = 0;
      iVar2 = fy_path_open(fyp,(fyi->cfg).field_2.stream.name,in_RDX);
      (fyi->field_11).file.fd = iVar2;
      if (iVar2 == -1) {
        fmt = "failed to open %s";
        iVar2 = 0x14d;
      }
      else {
        iVar2 = fstat(iVar2,&local_b8);
        if (iVar2 != -1) {
          (fyi->field_11).file.length = local_b8.st_size;
          if ((0 < local_b8.st_size) &&
             (((fyp->cfg).flags & FYPCF_DISABLE_MMAP_OPT) == FYPCF_COLOR_AUTO)) {
            pvVar3 = mmap((void *)0x0,local_b8.st_size,1,2,(fyi->field_11).file.fd,0);
            if (pvVar3 == (void *)0xffffffffffffffff) {
              pvVar3 = (void *)0x0;
            }
            (fyi->field_11).file.addr = pvVar3;
          }
          if ((fyi->field_11).file.addr == (void *)0x0) {
            fy_parser_diag(fyp,0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                           ,0x163,"fy_parse_input_open",
                           "direct mmap mode unavailable for file %s, switching to stream mode",
                           (fyi->cfg).field_2.stream.name);
            pFVar4 = fdopen((fyi->field_11).file.fd,"r");
            fyi->fp = (FILE *)pFVar4;
            (fyi->field_11).file.fd = -1;
            __size = sysconf(0x1e);
            fyi->chunk = __size;
            pvVar3 = malloc(__size);
            fyi->buffer = pvVar3;
            if (pvVar3 == (void *)0x0) {
              fmt = "fy_alloc() failed";
              iVar2 = 0x170;
              goto LAB_0013a75f;
            }
            fyi->allocated = __size;
          }
          goto LAB_0013a6d7;
        }
        fmt = "failed to fstat %s";
        iVar2 = 0x151;
      }
    }
LAB_0013a75f:
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                   ,iVar2,"fy_parse_input_open",fmt);
    fy_input_close(fyi);
  }
  return iVar5;
}

Assistant:

int fy_parse_input_open(struct fy_parser *fyp, struct fy_input *fyi) {
    struct stat sb;
    int rc;

    if (!fyi)
        return -1;

    assert(fyi->state == FYIS_QUEUED);

    /* reset common data */
    fyi->buffer = NULL;
    fyi->allocated = 0;
    fyi->read = 0;
    fyi->chunk = 0;
    fyi->fp = NULL;

    switch (fyi->cfg.type) {
        case fyit_file:
            memset(&fyi->file, 0, sizeof(fyi->file));
            fyi->file.fd = fy_path_open(fyp, fyi->cfg.file.filename, NULL);
            fyp_error_check(fyp, fyi->file.fd != -1, err_out,
                            "failed to open %s", fyi->cfg.file.filename);

            rc = fstat(fyi->file.fd, &sb);
            fyp_error_check(fyp, rc != -1, err_out,
                            "failed to fstat %s", fyi->cfg.file.filename);

            fyi->file.length = sb.st_size;

            /* only map if not zero (and is not disabled) */
            if (sb.st_size > 0 && !(fyp->cfg.flags & FYPCF_DISABLE_MMAP_OPT)) {
                fyi->file.addr = mmap(NULL, sb.st_size, PROT_READ, MAP_PRIVATE,
                                      fyi->file.fd, 0);

                /* convert from MAP_FAILED to NULL */
                if (fyi->file.addr == MAP_FAILED)
                    fyi->file.addr = NULL;
            }
            /* if we've managed to mmap, we' good */
            if (fyi->file.addr)
                break;

            fyp_scan_debug(fyp, "direct mmap mode unavailable for file %s, switching to stream mode",
                           fyi->cfg.file.filename);

            fyi->fp = fdopen(fyi->file.fd, "r");
            fyp_error_check(fyp, rc != -1, err_out,
                            "failed to fdopen %s", fyi->cfg.file.filename);

            /* fd ownership assigned to file */
            fyi->file.fd = -1;

            /* switch to stream mode */
            fyi->chunk = sysconf(_SC_PAGESIZE);
            fyi->buffer = malloc(fyi->chunk);
            fyp_error_check(fyp, fyi->buffer, err_out,
                            "fy_alloc() failed");
            fyi->allocated = fyi->chunk;
            break;

        case fyit_stream:
            memset(&fyi->stream, 0, sizeof(fyi->stream));
            fyi->chunk = fyi->cfg.stream.chunk;
            if (!fyi->chunk)
                fyi->chunk = sysconf(_SC_PAGESIZE);
            fyi->buffer = malloc(fyi->chunk);
            fyp_error_check(fyp, fyi->buffer, err_out,
                            "fy_alloc() failed");
            fyi->allocated = fyi->chunk;
            fyi->fp = fyi->cfg.stream.fp;
            break;

        case fyit_memory:
            /* nothing to do for memory */
            break;

        case fyit_alloc:
            /* nothing to do for memory */
            break;

        default:
            assert(0);
            break;
    }

    fyi->state = FYIS_PARSE_IN_PROGRESS;

    return 0;

    err_out:
    fy_input_close(fyi);
    return -1;
}